

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

char * fl_utf8fwd(char *p,char *start,char *end)

{
  wchar_t local_34;
  byte *pbStack_30;
  wchar_t len;
  char *a;
  char *end_local;
  char *start_local;
  char *p_local;
  
  p_local = p;
  if (((int)*p & 0xc0U) == 0x80) {
    pbStack_30 = (byte *)(p + -1);
    while( true ) {
      if (pbStack_30 < start) {
        return p;
      }
      if (((int)(char)*pbStack_30 & 0x80U) == 0) {
        return p;
      }
      if ((*pbStack_30 & 0x40) != 0) break;
      pbStack_30 = pbStack_30 + -1;
    }
    a = end;
    end_local = start;
    start_local = p;
    fl_utf8decode((char *)pbStack_30,end,&local_34);
    p_local = (char *)(pbStack_30 + local_34);
    if (p_local <= start_local) {
      p_local = start_local;
    }
  }
  return p_local;
}

Assistant:

const char* fl_utf8fwd(const char* p, const char* start, const char* end)
{
  const char* a;
  int len;
  /* if we are not pointing at a continuation character, we are done: */
  if ((*p&0xc0) != 0x80) return p;
  /* search backwards for a 0xc0 starting the character: */
  for (a = p-1; ; --a) {
    if (a < start) return p;
    if (!(a[0]&0x80)) return p;
    if ((a[0]&0x40)) break;
  }
  fl_utf8decode(a,end,&len);
  a += len;
  if (a > p) return a;
  return p;
}